

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

int __thiscall
kj::ArrayBuilder<kj::HashMap<kj::String,_int>::Entry>::truncate
          (ArrayBuilder<kj::HashMap<kj::String,_int>::Entry> *this,char *__file,__off_t __length)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  undefined8 uVar4;
  
  lVar1 = *(long *)this;
  uVar2 = *(ulong *)(this + 8);
  while ((ulong)((long)__file * 0x20 + lVar1) < uVar2) {
    *(undefined8 **)(this + 8) = (undefined8 *)(uVar2 - 0x20);
    lVar3 = *(long *)(uVar2 - 0x20);
    if (lVar3 != 0) {
      uVar4 = *(undefined8 *)(uVar2 - 0x18);
      *(undefined8 *)(uVar2 - 0x20) = 0;
      *(undefined8 *)(uVar2 - 0x18) = 0;
      (**(code **)**(undefined8 **)(uVar2 - 0x10))
                (*(undefined8 **)(uVar2 - 0x10),lVar3,1,uVar4,uVar4,0);
    }
    uVar2 = *(ulong *)(this + 8);
  }
  return (int)uVar2;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(target);
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }